

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O0

PlusSignMatcher * __thiscall
icu_63::numparse::impl::PlusSignMatcher::operator=(PlusSignMatcher *this,PlusSignMatcher *param_1)

{
  PlusSignMatcher *param_1_local;
  PlusSignMatcher *this_local;
  
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  this->fAllowTrailing = (bool)(param_1->fAllowTrailing & 1);
  return this;
}

Assistant:

class U_I18N_API PlusSignMatcher : public SymbolMatcher {
  public:
    PlusSignMatcher() = default;  // WARNING: Leaves the object in an unusable state

    PlusSignMatcher(const DecimalFormatSymbols& dfs, bool allowTrailing);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;

  private:
    bool fAllowTrailing;
}